

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::EnumGenerator::GenerateGetEnumDescriptorSpecializations
          (EnumGenerator *this,Printer *printer)

{
  bool in_CL;
  undefined1 qualified;
  string sStack_38;
  
  qualified = SUB81(&sStack_38,0);
  ClassName_abi_cxx11_(&sStack_38,(cpp *)this->descriptor_,(EnumDescriptor *)0x1,in_CL);
  io::Printer::Print(printer,
                     "template <> struct is_proto_enum< $classname$> : ::google::protobuf::internal::true_type {};\n"
                     ,"classname",&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  if ((this->options_->enforce_lite == false) &&
     (*(int *)(*(long *)(*(long *)((cpp *)this->descriptor_ + 0x10) + 0xa0) + 0xa8) != 3)) {
    ClassName_abi_cxx11_(&sStack_38,(cpp *)this->descriptor_,(EnumDescriptor *)0x1,(bool)qualified);
    io::Printer::Print(printer,
                       "template <>\ninline const EnumDescriptor* GetEnumDescriptor< $classname$>() {\n  return $classname$_descriptor();\n}\n"
                       ,"classname",&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return;
}

Assistant:

void EnumGenerator::
GenerateGetEnumDescriptorSpecializations(io::Printer* printer) {
  printer->Print(
      "template <> struct is_proto_enum< $classname$> : ::google::protobuf::internal::true_type "
      "{};\n",
      "classname", ClassName(descriptor_, true));
  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    printer->Print(
      "template <>\n"
      "inline const EnumDescriptor* GetEnumDescriptor< $classname$>() {\n"
      "  return $classname$_descriptor();\n"
      "}\n",
      "classname", ClassName(descriptor_, true));
  }
}